

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Index __thiscall wasm::Builder::addParam(Builder *this,Function *func,Name name,Type type)

{
  Index IVar1;
  Module *pMVar2;
  Module *pMVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  Iterator __first;
  Signature SVar7;
  Iterator __last;
  undefined1 local_70 [8];
  Signature sig;
  undefined1 auStack_58 [8];
  Name name_local;
  Type type_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Index index;
  
  name_local.super_IString.str._M_str = name.super_IString.str._M_str;
  name_local.super_IString.str._M_len = name.super_IString.str._M_len;
  pMVar2 = this[0x17].wasm;
  auStack_58 = (undefined1  [8])func;
  SVar7 = HeapType::getSignature((HeapType *)(this + 7));
  type_local = SVar7.params.id;
  pMVar3 = (Module *)wasm::Type::size(&type_local);
  if (pMVar2 != pMVar3) {
    __assert_fail("func->localIndices.size() == func->getParams().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                  ,0x523,"static Index wasm::Builder::addParam(Function *, Name, Type)");
  }
  if (name_local.super_IString.str._M_len != 0) {
    _local_70 = HeapType::getSignature((HeapType *)(this + 7));
    sVar4 = wasm::Type::size((Type *)local_70);
    __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)local_70;
    __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar4;
    __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)local_70;
    std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)&type_local,__first,__last,
               (allocator_type *)
               &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start ==
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&type_local,
                 (iterator)
                 params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start,(Type *)&name_local.super_IString.str._M_str);
    }
    else {
      (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_start)->id = (uintptr_t)name_local.super_IString.str._M_str;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    wasm::Type::Type(&sig.results,(Tuple *)&type_local);
    SVar7.results.id = sig.params.id;
    SVar7.params.id = sig.results.id;
    HeapType::HeapType((HeapType *)
                       &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,SVar7);
    this[7].wasm = (Module *)
                   CONCAT44(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                            (Index)params.
                                   super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    IVar1 = *(Index *)&this[0x10].wasm;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = IVar1;
    pmVar5 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)(this + 0x14),(key_type *)auStack_58);
    *pmVar5 = IVar1;
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(this + 0xd),
                          (key_type *)
                          &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    IVar1 = (Index)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    (pmVar6->super_IString).str._M_len = (size_t)auStack_58;
    (pmVar6->super_IString).str._M_str = (char *)name_local.super_IString.str._M_len;
    if (type_local.id != 0) {
      operator_delete((void *)type_local.id,
                      (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - type_local.id);
    }
    return IVar1;
  }
  __assert_fail("name.is()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x524,"static Index wasm::Builder::addParam(Function *, Name, Type)");
}

Assistant:

static Index addParam(Function* func, Name name, Type type) {
    // only ok to add a param if no vars, otherwise indices are invalidated
    assert(func->localIndices.size() == func->getParams().size());
    assert(name.is());
    Signature sig = func->getSig();
    std::vector<Type> params(sig.params.begin(), sig.params.end());
    params.push_back(type);
    func->type = Signature(Type(params), sig.results);
    Index index = func->localNames.size();
    func->localIndices[name] = index;
    func->localNames[index] = name;
    return index;
  }